

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitPop
          (Flow *__return_storage_ptr__,
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this,Pop *curr)

{
  pointer pLVar1;
  char cVar2;
  Type TVar3;
  Flow *pFVar4;
  undefined1 local_60 [8];
  value_type ret;
  
  pLVar1 = (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>.
      _M_impl.super__Vector_impl_data._M_start == pLVar1) {
    __assert_fail("!multiValues.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                  ,0x114d,
                  "Flow wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::visitPop(Pop *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                 );
  }
  SmallVector<wasm::Literal,_1UL>::SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)local_60,
             &pLVar1[-1].super_SmallVector<wasm::Literal,_1UL>);
  TVar3 = Literals::getType((Literals *)local_60);
  cVar2 = wasm::Type::isSubType(TVar3,(Type)*(uintptr_t *)(curr + 8));
  if (cVar2 != '\0') {
    pLVar1 = (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->multiValues).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar1 + -1;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              (&pLVar1[-1].super_SmallVector<wasm::Literal,_1UL>.flexible);
    wasm::Literal::~Literal(pLVar1[-1].super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_60;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&ret);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)ret.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ret.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ret.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ret.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ret.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ret.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &ret.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    pFVar4 = (Flow *)wasm::Literal::~Literal((Literal *)&ret);
    return pFVar4;
  }
  __assert_fail("Type::isSubType(ret.getType(), curr->type)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                ,0x114f,
                "Flow wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::visitPop(Pop *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
               );
}

Assistant:

Flow visitPop(Pop* curr) {
    NOTE_ENTER("Pop");
    assert(!multiValues.empty());
    auto ret = multiValues.back();
    assert(Type::isSubType(ret.getType(), curr->type));
    multiValues.pop_back();
    return ret;
  }